

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acecMult.c
# Opt level: O2

Vec_Int_t * Acec_MultDetectInputs(Gia_Man_t *p,Vec_Wec_t *vLeafLits,Vec_Wec_t *vRootLits)

{
  int iVar1;
  uint uVar2;
  int i;
  uint uVar3;
  Vec_Int_t *pVVar4;
  Vec_Int_t *p_00;
  Vec_Wrd_t *p_01;
  Vec_Int_t *p_02;
  Vec_Int_t *p_03;
  Gia_Obj_t *pGVar5;
  ulong uVar6;
  Gia_Obj_t *pGVar7;
  Vec_Int_t *p_04;
  int iVar8;
  uint uVar9;
  word Truth;
  
  pVVar4 = Vec_IntAlloc(100);
  p_00 = Vec_IntAlloc(100);
  p_01 = Vec_WrdStart(p->nObjs);
  p_02 = Vec_IntStart(p->nObjs);
  p_03 = Vec_IntStart(p->nObjs);
  if (p->pRefs != (int *)0x0) {
    free(p->pRefs);
    p->pRefs = (int *)0x0;
  }
  Gia_ManCreateRefs(p);
  for (iVar8 = 0; iVar8 < p->vCis->nSize; iVar8 = iVar8 + 1) {
    iVar1 = Vec_IntEntry(p->vCis,iVar8);
    pGVar5 = Gia_ManObj(p,iVar1);
    pGVar7 = p->pObjs;
    if ((pGVar5 < pGVar7) || (pGVar7 + p->nObjs <= pGVar5)) {
      __assert_fail("p->pObjs <= pObj && pObj < p->pObjs + p->nObjs",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/aig/gia/gia.h"
                    ,0x1d9,"int Gia_ObjId(Gia_Man_t *, Gia_Obj_t *)");
    }
    uVar6 = ((long)pGVar5 - (long)pGVar7) / 0xc;
    iVar1 = (int)uVar6;
    if (iVar1 == 0) break;
    printf("%d=%d ",uVar6 & 0xffffffff,(ulong)(uint)p->pRefs[iVar1]);
  }
  putchar(10);
  for (uVar6 = 0; (long)uVar6 < (long)p->nObjs; uVar6 = uVar6 + 1) {
    pGVar7 = Gia_ManObj(p,(int)uVar6);
    if (((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) && (3 < p->pRefs[uVar6])
       ) {
      printf("%d=%d ",uVar6 & 0xffffffff);
    }
  }
  putchar(10);
  for (uVar9 = 0; (int)uVar9 < vLeafLits->nSize; uVar9 = uVar9 + 1) {
    p_04 = Vec_WecEntry(vLeafLits,uVar9);
    for (iVar8 = 0; iVar8 < p_04->nSize; iVar8 = iVar8 + 1) {
      iVar1 = Vec_IntEntry(p_04,iVar8);
      Truth = Gia_ObjComputeTruth6Cis(p,iVar1,p_00,p_01);
      if (-1 < p_00->nSize) {
        uVar2 = Abc_Lit2Var(iVar1);
        printf("Leaf = %4d : ",(ulong)uVar2);
        printf("Rank = %2d  ",(ulong)uVar9);
        printf("Supp = %2d  ",(ulong)(uint)p_00->nSize);
        Extra_PrintHex(_stdout,(uint *)&Truth,p_00->nSize);
        iVar1 = p_00->nSize;
        if (iVar1 == 4) {
          printf("    ");
          iVar1 = p_00->nSize;
        }
        if (iVar1 == 3) {
          printf("      ");
          iVar1 = p_00->nSize;
        }
        if (iVar1 < 3) {
          printf("       ");
        }
        printf("  ");
        Vec_IntPrint(p_00);
      }
      for (iVar1 = 0; iVar1 < p_00->nSize; iVar1 = iVar1 + 1) {
        i = Vec_IntEntry(p_00,iVar1);
        Vec_IntAddToEntry(p_02,i,uVar9);
        Vec_IntAddToEntry(p_03,i,1);
      }
      if (iVar8 == p_04->nSize + -1) {
        putchar(10);
      }
    }
  }
  uVar9 = p_03->nSize;
  uVar2 = 0;
  if ((int)uVar9 < 1) {
    uVar9 = 0;
  }
  for (; uVar9 != uVar2; uVar2 = uVar2 + 1) {
    uVar3 = Vec_IntEntry(p_03,uVar2);
    if (uVar3 != 0) {
      iVar8 = Vec_IntEntry(p_02,uVar2);
      printf("%d=%d(%.2f) ",(double)iVar8 / (double)(int)uVar3,(ulong)uVar2,(ulong)uVar3);
    }
  }
  putchar(10);
  Vec_IntFree(p_00);
  Vec_WrdFree(p_01);
  Vec_IntFree(p_02);
  Vec_IntFree(p_03);
  return pVVar4;
}

Assistant:

Vec_Int_t * Acec_MultDetectInputs( Gia_Man_t * p, Vec_Wec_t * vLeafLits, Vec_Wec_t * vRootLits )
{
    Vec_Int_t * vInputs = Vec_IntAlloc( 100 );
    Vec_Int_t * vSupp = Vec_IntAlloc( 100 );
    Vec_Wrd_t * vTemp = Vec_WrdStart( Gia_ManObjNum(p) );
    Vec_Int_t * vRanks  = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vCounts = Vec_IntStart( Gia_ManObjNum(p) );
    Vec_Int_t * vLevel;
    int i, k, iLit, iObj, j, Entry;

    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p );
    Gia_ManForEachCiId( p, iObj, i )
        printf( "%d=%d ", iObj, Gia_ObjRefNumId(p, iObj) );
    printf( "\n" );
    Gia_ManForEachAndId( p, iObj )
        if ( Gia_ObjRefNumId(p, iObj) >= 4 )
            printf( "%d=%d ", iObj, Gia_ObjRefNumId(p, iObj) );
    printf( "\n" );

    Vec_WecForEachLevel( vLeafLits, vLevel, i )
        Vec_IntForEachEntry( vLevel, iLit, k )
        {
            word Truth = Gia_ObjComputeTruth6Cis( p, iLit, vSupp, vTemp );
            if ( Vec_IntSize(vSupp) >= 0 )
            {
                printf( "Leaf = %4d : ", Abc_Lit2Var(iLit) );
                printf( "Rank = %2d  ", i );
                printf( "Supp = %2d  ", Vec_IntSize(vSupp) );
                Extra_PrintHex( stdout, (unsigned*)&Truth, Vec_IntSize(vSupp) );
                if ( Vec_IntSize(vSupp) == 4 ) printf( "    " );
                if ( Vec_IntSize(vSupp) == 3 ) printf( "      " );
                if ( Vec_IntSize(vSupp) <= 2 ) printf( "       " );
                printf( "  " );
                Vec_IntPrint( vSupp );
                /*
                if ( Truth == 0xF335ACC0F335ACC0 )
                {
                    int iObj = Abc_Lit2Var(iLit);
                    Gia_Man_t * pGia0 = Gia_ManDupAndCones( p, &iObj, 1, 1 );
                    Gia_ManShow( pGia0, NULL, 0, 0, 0 );
                    Gia_ManStop( pGia0 );
                }
                */
            }
            // support rank counts
            Vec_IntForEachEntry( vSupp, Entry, j )
            {
                Vec_IntAddToEntry( vRanks, Entry, i );
                Vec_IntAddToEntry( vCounts, Entry, 1 );
            }
            if ( k == Vec_IntSize(vLevel)-1 )
                printf( "\n" );
        }

    Vec_IntForEachEntry( vCounts, Entry, j )
        if ( Entry )
            printf( "%d=%d(%.2f) ", j, Entry, 1.0*Vec_IntEntry(vRanks, j)/Entry );
    printf( "\n" );

    Vec_IntFree( vSupp );
    Vec_WrdFree( vTemp );
    Vec_IntFree( vRanks );
    Vec_IntFree( vCounts );
    return vInputs;
}